

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O1

void __thiscall
Projection::install_level
          (Projection *this,int level,AmrLevel *level_data,
          Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
          *_radius)

{
  ostringstream *this_00;
  EBFArrayBoxFactory *pEVar1;
  size_type __new_size;
  long lVar2;
  char local_1b9;
  Print local_1b8;
  
  if (verbose != 0) {
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
    this_00 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Installing projector level ",0x1b);
    std::ostream::operator<<(this_00,level);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
  }
  lVar2 = (long)level;
  if ((long)(this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
            super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3 <= lVar2) {
    __new_size = (long)*(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
                 + 1;
    std::vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>::resize
              (&(this->LevelData).
                super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>,__new_size);
    std::
    vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
    ::resize(&(this->radius).
              super_vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
             ,__new_size);
  }
  (this->LevelData).super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
  super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>._M_impl.
  super__Vector_impl_data._M_start[lVar2] = level_data;
  (this->radius).
  super_vector<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
  .
  super__Vector_base<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*,_std::allocator<amrex::Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start[lVar2] = _radius;
  pEVar1 = (EBFArrayBoxFactory *)
           __dynamic_cast((tuple<amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           )((this->LevelData).
                             super_vector<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>.
                             super__Vector_base<amrex::AmrLevel_*,_std::allocator<amrex::AmrLevel_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar2]->m_factory)._M_t.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar1 != (EBFArrayBoxFactory *)0x0) {
    (this->ebfactory).
    super_vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    .
    super__Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ._M_impl.super__Vector_impl_data._M_start[lVar2] = pEVar1;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
Projection::install_level (int                     level,
                           AmrLevel*               level_data,
                           Vector< Vector<Real> >* _radius)
{
    if (verbose) amrex::Print() << "Installing projector level " << level << '\n';

    int finest_level = parent->finestLevel();

    if (level > LevelData.size() - 1)
    {
        LevelData.resize(finest_level+1);
        radius.resize(finest_level+1);
    }

    LevelData[level] = level_data;
    radius[level] = _radius;

#ifdef AMREX_USE_EB
    const auto& _ebfactory =
      dynamic_cast<EBFArrayBoxFactory const&>(LevelData[level]->Factory());
    ebfactory[level] = &_ebfactory;
#endif
}